

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

pair<const_void_*,_int> __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FindFile
          (DescriptorIndex *this,string_view filename)

{
  size_t __n;
  pointer pEVar1;
  int iVar2;
  __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>_>
  _Var3;
  void *pvVar4;
  ulong uVar5;
  pair<const_void_*,_int> pVar6;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  local_20._M_str = filename._M_str;
  local_20._M_len = filename._M_len;
  EnsureFlat(this);
  _Var3 = std::
          __lower_bound<__gnu_cxx::__normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry*,std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>>>,std::basic_string_view<char,std::char_traits<char>>,__gnu_cxx::__ops::_Iter_comp_val<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare>>
                    ((this->by_name_flat_).
                     super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->by_name_flat_).
                     super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_20,
                     (_Iter_comp_val<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare>
                      )(this->by_name_).
                       super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>_>
                       .
                       super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>_>
                       .tree_.rightmost_.
                       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>::checked_compare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
                       .
                       super_Storage<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>::checked_compare,_0UL,_false>
                       .value.
                       super_checked_compare_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_true>
                       .super_FileCompare.index);
  if ((_Var3._M_current ==
       (this->by_name_flat_).
       super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
       ._M_impl.super__Vector_impl_data._M_finish) ||
     (__n = ((_Var3._M_current)->encoded_name)._M_string_length, __n != local_20._M_len)) {
LAB_00266cc2:
    pvVar4 = (void *)0x0;
    uVar5 = 0;
  }
  else {
    if (__n != 0) {
      iVar2 = bcmp(((_Var3._M_current)->encoded_name)._M_dataplus._M_p,local_20._M_str,__n);
      if (iVar2 != 0) goto LAB_00266cc2;
    }
    pEVar1 = (this->all_values_).
             super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar4 = pEVar1[(_Var3._M_current)->data_offset].data;
    uVar5 = (ulong)(uint)pEVar1[(_Var3._M_current)->data_offset].size;
  }
  pVar6._8_8_ = uVar5;
  pVar6.first = pvVar4;
  return pVar6;
}

Assistant:

std::pair<const void*, int>
EncodedDescriptorDatabase::DescriptorIndex::FindFile(
    absl::string_view filename) {
  EnsureFlat();

  auto it = std::lower_bound(by_name_flat_.begin(), by_name_flat_.end(),
                             filename, by_name_.key_comp());
  return it == by_name_flat_.end() || it->name(*this) != filename
             ? std::make_pair(nullptr, 0)
             : all_values_[it->data_offset].value();
}